

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigSavePattern2(Ivy_FraigMan_t *p)

{
  int *piVar1;
  int i;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  for (i = 0; i < p->vPiVars->nSize; i = i + 1) {
    piVar1 = (int *)Vec_PtrEntry(p->vPiVars,i);
    if (p->pSat->model[piVar1[10]] == 1) {
      p->pPatWords[*piVar1 + -1 >> 5] =
           p->pPatWords[*piVar1 + -1 >> 5] | 1 << ((byte)(*piVar1 + -1) & 0x1f);
    }
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern2( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
//    Ivy_ManForEachPi( p->pManFraig, pObj, i )
    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True )
        if ( p->pSat->model[Ivy_ObjSatNum(pObj)] == l_True )
//            Ivy_InfoSetBit( p->pPatWords, i );
            Ivy_InfoSetBit( p->pPatWords, pObj->Id - 1 );
}